

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

void nni_thr_wrap(void *arg)

{
  nni_plat_mtx *mtx;
  bool bVar1;
  
  mtx = (nni_plat_mtx *)((long)arg + 0x18);
  nni_plat_mtx_lock(mtx);
  bVar1 = *(int *)((long)arg + 0x88) == 0;
  if (bVar1) {
    if (*(int *)((long)arg + 0x8c) == 0) {
      do {
        nni_plat_cv_wait((nni_plat_cv *)((long)arg + 0x40));
        bVar1 = *(int *)((long)arg + 0x88) == 0;
        if (!bVar1) goto LAB_00117cf6;
      } while (*(int *)((long)arg + 0x8c) == 0);
    }
    nni_plat_mtx_unlock(mtx);
    if (bVar1) goto LAB_00117d4d;
  }
  else {
LAB_00117cf6:
    nni_plat_mtx_unlock(mtx);
  }
  if (*(code **)((long)arg + 0x78) != (code *)0x0) {
    (**(code **)((long)arg + 0x78))(*(undefined8 *)((long)arg + 0x80));
  }
LAB_00117d4d:
  nni_plat_mtx_lock(mtx);
  *(undefined4 *)((long)arg + 0x90) = 1;
  nni_plat_cv_wake((nni_plat_cv *)((long)arg + 0x40));
  nni_plat_mtx_unlock(mtx);
  return;
}

Assistant:

static void
nni_thr_wrap(void *arg)
{
	nni_thr *thr = arg;
	int      start;

	nni_plat_mtx_lock(&thr->mtx);
	while (((start = thr->start) == 0) && (thr->stop == 0)) {
		nni_plat_cv_wait(&thr->cv);
	}
	nni_plat_mtx_unlock(&thr->mtx);
	if ((start) && (thr->fn != NULL)) {
		thr->fn(thr->arg);
	}
	nni_plat_mtx_lock(&thr->mtx);
	thr->done = 1;
	nni_plat_cv_wake(&thr->cv);
	nni_plat_mtx_unlock(&thr->mtx);
}